

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

void __thiscall
ft::deque<char,_ft::allocator<char>_>::push_back
          (deque<char,_ft::allocator<char>_> *this,value_type_conflict *val)

{
  size_type n;
  pointer pcVar1;
  value_type_conflict *val_local;
  deque<char,_ft::allocator<char>_> *this_local;
  
  if ((this->m_finish).m_cur + 1 == (this->m_finish).m_last) {
    if ((this->m_finish).m_node == this->m_map + (this->m_map_size - 1)) {
      realloc(this,val,this->m_map_size * 8);
    }
    if ((this->m_finish).m_node[1] == (pointer)0x0) {
      n = chunk_size(this);
      pcVar1 = allocator<char>::allocate((allocator<char> *)&this->field_0x70,n);
      (this->m_finish).m_node[1] = pcVar1;
      this->m_chunks = this->m_chunks + 1;
    }
  }
  allocator<char>::construct((allocator<char> *)&this->field_0x70,(this->m_finish).m_cur,val);
  dequeIterator<char,_64UL>::operator++(&this->m_finish);
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void push_back(value_type const & val) {
		if (this->m_finish.m_cur + 1 == this->m_finish.m_last) {
			if (this->m_finish.m_node == this->m_map + this->m_map_size - 1) {
				this->realloc();
			}
			if (*(this->m_finish.m_node + 1) == NULL) {
				*(this->m_finish.m_node + 1) = this->m_alloc.allocate(this->chunk_size());
				++this->m_chunks;
			}
		}
		this->m_alloc.construct(this->m_finish.m_cur, val);
		++this->m_finish;
		++this->m_size;
	}